

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpNodeClass(void *p,void *va,void *vb)

{
  uint uVar1;
  fourcc_t AClass;
  fourcc_t *b;
  node **a;
  void *vb_local;
  void *va_local;
  void *p_local;
  
  uVar1 = *(uint *)(*(long *)(*va + 8) + 8);
  if (*vb < uVar1) {
    p_local._4_4_ = 1;
  }
  else if (uVar1 < *vb) {
    p_local._4_4_ = -1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static NOINLINE int CmpNodeClass(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const node* const* a = va;
    const fourcc_t* b = vb;
    fourcc_t AClass = NodeClass_ClassId(NodeGetClass(*a));
    if (AClass > *b) return 1;
    if (AClass < *b) return -1;
    return 0;
}